

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

int VP8PutBit(VP8BitWriter *bw,int bit,int prob)

{
  byte bVar1;
  uint uVar2;
  int in_EDX;
  int in_ESI;
  uint *in_RDI;
  int shift;
  int split;
  
  uVar2 = (int)(*in_RDI * in_EDX) >> 8;
  if (in_ESI == 0) {
    *in_RDI = uVar2;
  }
  else {
    in_RDI[1] = uVar2 + 1 + in_RDI[1];
    *in_RDI = *in_RDI - (uVar2 + 1);
  }
  if ((int)*in_RDI < 0x7f) {
    bVar1 = "\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            [(int)*in_RDI];
    *in_RDI = (uint)kNewRange[(int)*in_RDI];
    in_RDI[1] = in_RDI[1] << (bVar1 & 0x1f);
    in_RDI[3] = (uint)bVar1 + in_RDI[3];
    if (0 < (int)in_RDI[3]) {
      Flush(_shift);
    }
  }
  return in_ESI;
}

Assistant:

int VP8PutBit(VP8BitWriter* const bw, int bit, int prob) {
  const int split = (bw->range * prob) >> 8;
  if (bit) {
    bw->value += split + 1;
    bw->range -= split + 1;
  } else {
    bw->range = split;
  }
  if (bw->range < 127) {   // emit 'shift' bits out and renormalize
    const int shift = kNorm[bw->range];
    bw->range = kNewRange[bw->range];
    bw->value <<= shift;
    bw->nb_bits += shift;
    if (bw->nb_bits > 0) Flush(bw);
  }
  return bit;
}